

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O2

bool __thiscall MP1Node::heartbeatRepHandler(MP1Node *this,void *env,char *data,int size)

{
  short sVar1;
  int iVar2;
  ostream *poVar3;
  MP1Node *this_00;
  MP1Node *pMVar4;
  pointer this_01;
  bool bVar5;
  Address replierAddr;
  Address local_70;
  undefined1 local_68 [64];
  
  poVar3 = std::operator<<((ostream *)&std::cout,"start heartbeatRepHandler...");
  std::endl<char,std::char_traits<char>>(poVar3);
  if (size < 6) {
    bVar5 = false;
  }
  else {
    local_70.addr._4_2_ = *(undefined2 *)(data + 4);
    local_70.addr._0_4_ = *(undefined4 *)data;
    pMVar4 = (MP1Node *)(local_68 + 0x20);
    this_00 = pMVar4;
    Address::getAddress_abi_cxx11_((string *)pMVar4,&local_70);
    iVar2 = getIdFromAddress(this_00,(string *)pMVar4);
    std::__cxx11::string::~string((string *)(local_68 + 0x20));
    pMVar4 = (MP1Node *)local_68;
    Address::getAddress_abi_cxx11_((string *)local_68,&local_70);
    sVar1 = getPortFromAddress(pMVar4,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    for (this_01 = (this->memberNode->memberList).
                   super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                   super__Vector_impl_data._M_start;
        bVar5 = this_01 !=
                (this->memberNode->memberList).
                super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
                super__Vector_impl_data._M_finish, bVar5; this_01 = this_01 + 1) {
      if ((this_01->id == iVar2) && (this_01->port == sVar1)) {
        iVar2 = Params::getcurrtime(this->par);
        MemberListEntry::settimestamp(this_01,(long)iVar2);
        this_01->heartbeat = this_01->heartbeat + 1;
        return bVar5;
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"...end heartbeatRepHandler.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return bVar5;
}

Assistant:

bool MP1Node::heartbeatRepHandler(void *env, char *data, int size) {
    cout << "start heartbeatRepHandler..." << endl;

    if (size < (int)(sizeof(memberNode->addr.addr))) {
        return false;
    }

    Address replierAddr;
    memcpy(&replierAddr.addr, data, sizeof(memberNode->addr.addr));

    int id = getIdFromAddress(replierAddr.getAddress());
    short port = getPortFromAddress(replierAddr.getAddress());

    for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin(); entry != memberNode->memberList.end(); entry++) {
        if (entry->id == id && entry->port == port) {
            entry->settimestamp( par->getcurrtime() );
            entry->heartbeat = entry->heartbeat + 1;
            return true;
        }
    }

    cout << "...end heartbeatRepHandler." << endl;
    return false;
}